

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

void js_sab_free(void *opaque,void *ptr)

{
  int iVar1;
  long in_RSI;
  int ref_count;
  JSSABHeader *sab;
  
  iVar1 = atomic_add_int((int *)(in_RSI + -8),-1);
  if (iVar1 == 0) {
    free((int *)(in_RSI + -8));
  }
  return;
}

Assistant:

static void js_sab_free(void *opaque, void *ptr)
{
    JSSABHeader *sab;
    int ref_count;
    sab = (JSSABHeader *)((uint8_t *)ptr - sizeof(JSSABHeader));
    ref_count = atomic_add_int(&sab->ref_count, -1);
    assert(ref_count >= 0);
    if (ref_count == 0) {
        free(sab);
    }
}